

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndCriteria.cpp
# Opt level: O0

ostream * QuantLib::operator<<(ostream *out,Type ec)

{
  uint in_ESI;
  ostream *in_RDI;
  ostream *local_8;
  
  switch(in_ESI) {
  case 0:
    local_8 = std::operator<<(in_RDI,"None");
    break;
  case 1:
    local_8 = std::operator<<(in_RDI,"MaxIterations");
    break;
  case 2:
    local_8 = std::operator<<(in_RDI,"StationaryPoint");
    break;
  case 3:
    local_8 = std::operator<<(in_RDI,"StationaryFunctionValue");
    break;
  case 4:
    local_8 = std::operator<<(in_RDI,"StationaryFunctionAccuracy");
    break;
  case 5:
    local_8 = std::operator<<(in_RDI,"ZeroGradientNorm");
    break;
  case 6:
    local_8 = std::operator<<(in_RDI,"Unknown");
    break;
  default:
    snprintf(painCave.errMsg,2000,"unknown EndCriteria::Type ( %d )\n",(ulong)in_ESI);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& out, EndCriteria::Type ec) {
    switch (ec) {
    case QuantLib::EndCriteria::None:
      return out << "None";
    case QuantLib::EndCriteria::MaxIterations:
      return out << "MaxIterations";
    case QuantLib::EndCriteria::StationaryPoint:
      return out << "StationaryPoint";
    case QuantLib::EndCriteria::StationaryFunctionValue:
      return out << "StationaryFunctionValue";
    case QuantLib::EndCriteria::StationaryFunctionAccuracy:
      return out << "StationaryFunctionAccuracy";
    case QuantLib::EndCriteria::ZeroGradientNorm:
      return out << "ZeroGradientNorm";
    case QuantLib::EndCriteria::Unknown:
      return out << "Unknown";
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "unknown EndCriteria::Type ( %d )\n", int(ec));
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }
    return out;
  }